

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Reader __thiscall capnp::_::anon_unknown_130::name(anon_unknown_130 *this,DynamicEnum e)

{
  StringPtr SVar1;
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar2;
  ArrayPtr<const_char> AVar3;
  char *local_128;
  Reader local_f8;
  Maybe<capnp::EnumSchema::Enumerant> local_b8;
  undefined1 local_70 [8];
  NullableValue<capnp::EnumSchema::Enumerant> schema;
  DynamicEnum e_local;
  size_t local_10;
  
  AVar3.size_ = local_10;
  AVar3.ptr = local_128;
  e_local.schema.super_Schema.raw._0_2_ = e.schema.super_Schema.raw._0_2_;
  schema.field_1._56_8_ = this;
  DynamicEnum::getEnumerant
            (&local_b8,(DynamicEnum *)&schema.field_1.value.proto._reader.nestingLimit);
  other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_b8);
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70,other);
  kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_b8);
  pEVar2 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_70);
  if (pEVar2 == (Enumerant *)0x0) {
    Text::Reader::Reader((Reader *)&e_local.value,"(unknown enumerant)");
  }
  else {
    pEVar2 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator->
                       ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
    EnumSchema::Enumerant::getProto(&local_f8,pEVar2);
    AVar3 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&local_f8);
    e_local._8_8_ = AVar3.ptr;
  }
  local_10 = AVar3.size_;
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
  SVar1.content.size_ = local_10;
  SVar1.content.ptr = (char *)e_local._8_8_;
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

Text::Reader name(DynamicEnum e) {
  KJ_IF_MAYBE(schema, e.getEnumerant()) {
    return schema->getProto().getName();
  } else {
    return "(unknown enumerant)";
  }
}